

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstreambuf.cpp
# Opt level: O3

bool __thiscall sai::ifstreambuf::FetchPage(ifstreambuf *this,uint32_t PageIndex,VirtualPage *Dest)

{
  ifstream *piVar1;
  bool bVar2;
  uint32_t uVar3;
  ulong uVar4;
  unique_ptr<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_> *puVar5;
  
  if (((&this->field_0x60)[*(long *)(*(long *)&this->FileIn + -0x18)] & 5) != 0) {
    return false;
  }
  piVar1 = &this->FileIn;
  if ((PageIndex & 0x1ff) == 0) {
    if (this->TableCacheIndex != PageIndex) {
      std::istream::seekg((long)piVar1,PageIndex << 0xc);
      std::istream::read((char *)piVar1,
                         (long)(this->TableCache)._M_t.
                               super___uniq_ptr_impl<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_sai::VirtualPage_*,_std::default_delete<sai::VirtualPage>_>
                               .super__Head_base<0UL,_sai::VirtualPage_*,_false>._M_head_impl);
      if (((&this->field_0x60)[*(long *)(*(long *)&this->FileIn + -0x18)] & 5) != 0) {
        return false;
      }
      VirtualPage::DecryptTable
                ((VirtualPage *)
                 &((this->TableCache)._M_t.
                   super___uniq_ptr_impl<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_sai::VirtualPage_*,_std::default_delete<sai::VirtualPage>_>
                   .super__Head_base<0UL,_sai::VirtualPage_*,_false>._M_head_impl)->u8,PageIndex);
      this->TableCacheIndex = PageIndex;
    }
    if (Dest == (VirtualPage *)0x0) {
      return true;
    }
    puVar5 = &this->TableCache;
  }
  else {
    if (this->PageCacheIndex != PageIndex) {
      bVar2 = FetchPage(this,PageIndex & 0xfffffe00,(VirtualPage *)0x0);
      if (!bVar2) {
        return false;
      }
      std::istream::seekg((long)piVar1,PageIndex << 0xc);
      std::istream::read((char *)piVar1,
                         (long)(this->PageCache)._M_t.
                               super___uniq_ptr_impl<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_sai::VirtualPage_*,_std::default_delete<sai::VirtualPage>_>
                               .super__Head_base<0UL,_sai::VirtualPage_*,_false>._M_head_impl);
      if (((&this->field_0x60)[*(long *)(*(long *)&this->FileIn + -0x18)] & 5) != 0) {
        return false;
      }
      uVar4 = (ulong)((PageIndex & 0x1ff) << 3);
      VirtualPage::DecryptData
                ((VirtualPage *)
                 &((this->PageCache)._M_t.
                   super___uniq_ptr_impl<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_sai::VirtualPage_*,_std::default_delete<sai::VirtualPage>_>
                   .super__Head_base<0UL,_sai::VirtualPage_*,_false>._M_head_impl)->u8,
                 *(uint32_t *)
                  ((long)(this->TableCache)._M_t.
                         super___uniq_ptr_impl<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_sai::VirtualPage_*,_std::default_delete<sai::VirtualPage>_>
                         .super__Head_base<0UL,_sai::VirtualPage_*,_false>._M_head_impl + uVar4));
      uVar3 = VirtualPage::Checksum
                        ((this->PageCache)._M_t.
                         super___uniq_ptr_impl<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_sai::VirtualPage_*,_std::default_delete<sai::VirtualPage>_>
                         .super__Head_base<0UL,_sai::VirtualPage_*,_false>._M_head_impl);
      if (uVar3 != *(uint32_t *)
                    ((long)(this->TableCache)._M_t.
                           super___uniq_ptr_impl<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_sai::VirtualPage_*,_std::default_delete<sai::VirtualPage>_>
                           .super__Head_base<0UL,_sai::VirtualPage_*,_false>._M_head_impl + uVar4))
      {
        return false;
      }
      this->PageCacheIndex = PageIndex;
    }
    if (Dest == (VirtualPage *)0x0) {
      return true;
    }
    puVar5 = &this->PageCache;
  }
  memcpy(Dest,(puVar5->_M_t).
              super___uniq_ptr_impl<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>._M_t.
              super__Tuple_impl<0UL,_sai::VirtualPage_*,_std::default_delete<sai::VirtualPage>_>.
              super__Head_base<0UL,_sai::VirtualPage_*,_false>._M_head_impl,0x1000);
  return true;
}

Assistant:

bool ifstreambuf::FetchPage(std::uint32_t PageIndex, VirtualPage* Dest)
{
	if( FileIn.fail() )
	{
		return false;
	}

	if( VirtualPage::IsTableIndex(PageIndex) ) // Table Block
	{
		if( PageIndex == TableCacheIndex )
		{
			// Cache Hit
			if( Dest != nullptr )
			{
				std::memcpy(Dest, TableCache.get(), VirtualPage::PageSize);
			}
			return true;
		}
		// Cache Miss
		// Get table cache
		FileIn.seekg(PageIndex * VirtualPage::PageSize, std::ios::beg);
		FileIn.read(reinterpret_cast<char*>(TableCache.get()), VirtualPage::PageSize);
		if( FileIn.fail() )
		{
			return false;
		}
		TableCache.get()->DecryptTable(PageIndex);
		TableCacheIndex = PageIndex;
		if( Dest != nullptr )
		{
			std::memcpy(Dest, TableCache.get(), VirtualPage::PageSize);
		}
	}
	else // Data Block
	{
		if( PageIndex == PageCacheIndex )
		{
			// Cache Hit
			if( Dest != nullptr )
			{
				std::memcpy(Dest, PageCache.get(), VirtualPage::PageSize);
			}
			return true;
		}
		// Prefetch nearest table
		// Ensure it is in the cache
		const std::uint32_t NearestTable = VirtualPage::NearestTableIndex(PageIndex);

		if( FetchPage(NearestTable, nullptr) == false )
		{
			// Failed to fetch table
			return false;
		}
		FileIn.seekg(PageIndex * VirtualPage::PageSize, std::ios::beg);
		FileIn.read(reinterpret_cast<char*>(PageCache.get()), VirtualPage::PageSize);
		if( FileIn.fail() )
		{
			return false;
		}
		PageCache.get()->DecryptData(
			TableCache.get()->PageEntries[PageIndex % VirtualPage::TableSpan].Checksum
		);

		if( PageCache.get()->Checksum()
			!= TableCache.get()->PageEntries[PageIndex % VirtualPage::TableSpan].Checksum )
		{
			// Checksum mismatch, file corrupt
			return false;
		}

		PageCacheIndex = PageIndex;
		if( Dest != nullptr )
		{
			std::memcpy(Dest, PageCache.get(), VirtualPage::PageSize);
		}
	}
	return true;
}